

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapChain.h
# Opt level: O0

void __thiscall Diligent::ISwapChain::ISwapChain(ISwapChain *this)

{
  ISwapChain *this_local;
  
  IObject::IObject(&this->super_IObject);
  (this->super_IObject)._vptr_IObject = (_func_int **)&PTR___cxa_pure_virtual_00593e28;
  return;
}

Assistant:

DILIGENT_BEGIN_INTERFACE(ISwapChain, IObject)
{
    /// Presents a rendered image to the user
    VIRTUAL void METHOD(Present)(THIS_
                                 Uint32 SyncInterval DEFAULT_VALUE(1)) PURE;

    /// Returns the swap chain description
    VIRTUAL const SwapChainDesc REF METHOD(GetDesc)(THIS) CONST PURE;

    /// Changes the swap chain size

    /// \param [in] NewWidth     - New logical swap chain width (not accounting for pre-transform), in pixels.
    /// \param [in] NewHeight    - New logical swap chain height (not accounting for pre-transform), in pixels.
    /// \param [in] NewTransform - New surface transform, see Diligent::SURFACE_TRANSFORM.
    ///
    /// \note When resizing non-primary swap chains, the engine unbinds the
    ///       swap chain buffers from the output.
    ///
    /// New width and height should not account for surface pre-transform. For example,
    /// if the window size is 1920 x 1080, but the surface is pre-rotated by 90 degrees,
    /// NewWidth should still be 1920, and NewHeight should still be 1080. It is highly
    /// recommended to always use Diligent::SURFACE_TRANSFORM_OPTIMAL to let the engine select
    /// the most optimal pre-transform. However Diligent::SURFACE_TRANSFORM_ROTATE_90 will also work in
    /// the scenario above. After the swap chain has been resized, its actual width will be 1080,
    /// actual height will be 1920, and `PreTransform` will be Diligent::SURFACE_TRANSFORM_ROTATE_90.
    VIRTUAL void METHOD(Resize)(THIS_
                                Uint32            NewWidth,
                                Uint32            NewHeight,
                                SURFACE_TRANSFORM NewTransform DEFAULT_VALUE(SURFACE_TRANSFORM_OPTIMAL)) PURE;

    /// Sets fullscreen mode (only supported on Win32 platform)
    VIRTUAL void METHOD(SetFullscreenMode)(THIS_ const DisplayModeAttribs REF DisplayMode) PURE;

    /// Sets windowed mode (only supported on Win32 platform)
    VIRTUAL void METHOD(SetWindowedMode)(THIS) PURE;

    /// Sets the maximum number of frames that the swap chain is allowed to queue for rendering.

    /// This value is only relevant for D3D11 and D3D12 backends and ignored for others.
    /// By default it matches the number of buffers in the swap chain. For example, for a 2-buffer
    /// swap chain, the CPU can enqueue frames 0 and 1, but Present command of frame 2
    /// will block until frame 0 is presented. If in the example above the maximum frame latency is set
    /// to 1, then Present command of frame 1 will block until Present of frame 0 is complete.
    VIRTUAL void METHOD(SetMaximumFrameLatency)(THIS_
                                                Uint32 MaxLatency) PURE;

    /// Returns render target view of the current back buffer in the swap chain

    /// For Direct3D12 and Vulkan backends, the function returns
    /// different pointer for every offscreen buffer in the swap chain
    /// (flipped by every call to ISwapChain::Present()). For Direct3D11
    /// backend it always returns the same pointer. For OpenGL/GLES backends
    /// the method returns null.
    ///
    /// The method does **NOT** increment the reference counter of the returned object,
    /// so Release() **must not** be called.
    VIRTUAL ITextureView* METHOD(GetCurrentBackBufferRTV)(THIS) PURE;

    /// Returns depth-stencil view of the depth buffer

    /// The method does **NOT** increment the reference counter of the returned object,
    /// so Release() **must not** be called.
    VIRTUAL ITextureView* METHOD(GetDepthBufferDSV)(THIS) PURE;
}